

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeBBox *a_rect,ON_SimpleArray<int> *a_result)

{
  bool bVar1;
  ulong uVar2;
  ulong extraout_RAX;
  long lVar3;
  long lVar4;
  undefined8 uStack_38;
  
  uVar2 = (ulong)a_node->m_count;
  if (0 < (long)uVar2) {
    uStack_38 = uVar2;
    if (a_node->m_level < 1) {
      lVar3 = uVar2 * 0x38;
      for (lVar4 = 0; lVar3 - lVar4 != 0; lVar4 = lVar4 + 0x38) {
        bVar1 = OverlapHelper(a_rect,(ON_RTreeBBox *)
                                     ((long)a_node->m_branch[0].m_rect.m_min + lVar4));
        uVar2 = (ulong)bVar1;
        if (bVar1) {
          uStack_38 = CONCAT44(*(undefined4 *)((long)(&a_node->m_branch[0].m_rect + 1) + lVar4),
                               (undefined4)uStack_38);
          ON_SimpleArray<int>::Append(a_result,(int *)((long)&uStack_38 + 4));
          uVar2 = extraout_RAX;
        }
      }
    }
    else {
      lVar4 = uVar2 * 0x38;
      for (lVar3 = 0; lVar4 - lVar3 != 0; lVar3 = lVar3 + 0x38) {
        bVar1 = OverlapHelper(a_rect,(ON_RTreeBBox *)
                                     ((long)a_node->m_branch[0].m_rect.m_min + lVar3));
        if (bVar1) {
          bVar1 = SearchHelper(*(ON_RTreeNode **)((long)(&a_node->m_branch[0].m_rect + 1) + lVar3),
                               a_rect,a_result);
        }
        uVar2 = (ulong)bVar1;
      }
    }
  }
  return SUB81(uVar2,0);
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, const ON_RTreeBBox* a_rect, ON_SimpleArray<int> &a_result)
{
  int i, count;

  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for( i=0; i < count; ++i )
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          if(!SearchHelper(branch[i].m_child, a_rect, a_result) )
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      for(i=0; i < count; ++i)
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          a_result.Append( (int)branch[i].m_id );
        }
      }
    }
  }

  return true; // Continue searching
}